

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O1

int __thiscall ReadData::ReadHead(ReadData *this,BUFF *socketdata,uchar *buff)

{
  ushort uVar1;
  int iVar2;
  uchar *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  uchar in_R9B;
  uchar uVar8;
  uchar in_R11B;
  
  iVar2 = socketdata->pos;
  if (iVar2 < socketdata->len) {
    iVar7 = -iVar2;
    puVar3 = socketdata->buff + iVar2;
    do {
      uVar8 = in_R9B;
      in_R9B = *puVar3;
      if (in_R9B == '\x12' && (uVar8 == 'D' && in_R11B == 0xaa)) {
        uVar4 = *(undefined8 *)(puVar3 + 9);
        uVar5 = *(undefined8 *)(puVar3 + 10);
        uVar6 = *(undefined8 *)(puVar3 + 0x12);
        *(undefined8 *)buff = *(undefined8 *)(puVar3 + 1);
        *(undefined8 *)(buff + 8) = uVar4;
        *(undefined8 *)(buff + 9) = uVar5;
        *(undefined8 *)(buff + 0x11) = uVar6;
        uVar1 = *(ushort *)(buff + 1);
        (this->Head).MessageID = (uint)uVar1;
        (this->Head).MessageLength = (uint)*(ushort *)(buff + 5);
        (this->Head).TimeStatus = (uint)buff[10];
        if (uVar1 == 0x2b) {
          (this->Head).GPST.Week = (uint)*(ushort *)(buff + 0xb);
          (this->Head).GPST.SOW = (double)*(int *)(buff + 0xd) / 1000.0;
        }
        (this->Head).HealthFlag = *(uint *)(buff + 0x11) & 1;
        socketdata->pos = (socketdata->pos - iVar7) + 0x1a;
        return 0;
      }
      iVar7 = iVar7 + -1;
      puVar3 = puVar3 + 1;
      in_R11B = uVar8;
    } while (-socketdata->len != iVar7);
  }
  return 0;
}

Assistant:

int ReadData::ReadHead(BUFF &socketdata, unsigned char* buff) {
    unsigned char HeadFlag[3];
    for(int i = socketdata.pos; i < socketdata.len; ++i) {
        HeadFlag[2] = socketdata.buff[i];
        if(HeadFlag[0] != 0xaa || HeadFlag[1] != 0x44 || HeadFlag[2] != 0x12)
        {
            HeadFlag[0] = HeadFlag[1];
            HeadFlag[1] = HeadFlag[2];
            continue;
        }        
        memcpy(buff, socketdata.buff + i + 1, 25);

        try
        {
            this->Head.MessageID = U2I((buff + 1), 2);
            this->Head.MessageLength = U2I((buff + 5), 2);
            this->Head.TimeStatus = U2I((buff + 10), 1);
            if(this->Head.MessageID == 43)
            {
                this->Head.GPST.Week = U2I((buff + 11), 2);
                this->Head.GPST.SOW = U2I((buff + 13), 4) / 1000.0;
            }
            this->Head.HealthFlag = (U2I((buff + 17), 4) & 1);
            socketdata.pos += i + 25 + 1;
        }
        catch(...)
        {
            cout << "error happened when reading head" << endl;
            return UNKNOWN_ERROR;
        }
        break;
    }
    return 0;
}